

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FunctionBody.cpp
# Opt level: O0

AuxArray<unsigned_int> * __thiscall
Js::FunctionBody::AllocateSlotIdInCachedScopeToNestedIndexArray(FunctionBody *this,uint32 slotCount)

{
  ScriptContext *this_00;
  Recycler *pRVar1;
  AuxArray<unsigned_int> *this_01;
  TrackAllocData local_48;
  AuxArray<unsigned_int> *local_20;
  AuxArray<unsigned_int> *slotIdToNestedIndexArray;
  FunctionBody *pFStack_10;
  uint32 slotCount_local;
  FunctionBody *this_local;
  
  slotIdToNestedIndexArray._4_4_ = slotCount;
  pFStack_10 = this;
  this_00 = FunctionProxy::GetScriptContext((FunctionProxy *)this);
  pRVar1 = ScriptContext::GetRecycler(this_00);
  Memory::TrackAllocData::CreateTrackAllocData
            (&local_48,(type_info *)&AuxArray<unsigned_int>::typeinfo,
             (ulong)slotIdToNestedIndexArray._4_4_ << 2,0xffffffffffffffff,
             "/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Base/FunctionBody.cpp"
             ,0x19d2);
  pRVar1 = Memory::Recycler::TrackAllocInfo(pRVar1,&local_48);
  this_01 = (AuxArray<unsigned_int> *)new<Memory::Recycler>(4,pRVar1,0x446eb0,0);
  AuxArray<unsigned_int>::AuxArray(this_01,slotIdToNestedIndexArray._4_4_);
  local_20 = this_01;
  SetSlotIdInCachedScopeToNestedIndexArray(this,this_01);
  return local_20;
}

Assistant:

Js::AuxArray<uint32> * FunctionBody::AllocateSlotIdInCachedScopeToNestedIndexArray(uint32 slotCount)
    {
        Js::AuxArray<uint32> * slotIdToNestedIndexArray = RecyclerNewPlusLeaf(GetScriptContext()->GetRecycler(), slotCount * sizeof(uint32), Js::AuxArray<uint32>, slotCount);
        SetSlotIdInCachedScopeToNestedIndexArray(slotIdToNestedIndexArray);
        return slotIdToNestedIndexArray;
    }